

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O0

bool __thiscall ON_Brep::SetTrimTypeFlags(ON_Brep *this,ON_BrepFace *face,bool bLazy)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  ON_BrepLoop *loop;
  int local_20;
  int face_loop_count;
  int fli;
  bool rc;
  bool bLazy_local;
  ON_BrepFace *face_local;
  ON_Brep *this_local;
  
  face_loop_count._2_1_ = true;
  iVar2 = ON_SimpleArray<int>::Count(&face->m_li);
  for (local_20 = 0; local_20 < iVar2; local_20 = local_20 + 1) {
    piVar3 = ON_SimpleArray<int>::operator[](&face->m_li,local_20);
    loop = ON_ClassArray<ON_BrepLoop>::operator[]((ON_ClassArray<ON_BrepLoop> *)&this->m_L,*piVar3);
    bVar1 = SetTrimTypeFlags(this,loop,bLazy);
    if (!bVar1) {
      face_loop_count._2_1_ = false;
    }
  }
  return face_loop_count._2_1_;
}

Assistant:

bool
ON_Brep::SetTrimTypeFlags( ON_BrepFace& face, bool bLazy )
{
  bool rc = true;
  int fli;
  const int face_loop_count = face.m_li.Count();
  for ( fli = 0; fli < face_loop_count; fli++ ) {
    if ( !SetTrimTypeFlags( m_L[face.m_li[fli]], bLazy ) )
      rc = false;
  }
  return rc;
}